

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PSVIWriterHandlers.cpp
# Opt level: O3

XMLCh * __thiscall PSVIWriterHandlers::getIdName(PSVIWriterHandlers *this,XSObject *obj)

{
  RefHashTableOf<char16_t,_xercesc_4_0::StringHasher> *pRVar1;
  BaseRefVectorOf<char16_t> *this_00;
  XMLSize_t XVar2;
  bool bVar3;
  wchar16 *key1;
  ulong uVar4;
  XMLCh *pXVar5;
  wchar16 *pwVar6;
  wchar16 wVar7;
  RefHashTableBucketElem<char16_t> *pRVar8;
  
  key1 = (wchar16 *)operator_new__(0x12);
  xercesc_4_0::XMLString::sizeToText
            ((ulong)obj,key1,8,0x10,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  pRVar1 = this->fIdMap;
  uVar4 = (ulong)(ushort)*key1;
  if (uVar4 == 0) {
    uVar4 = 0;
  }
  else {
    wVar7 = key1[1];
    if (wVar7 != L'\0') {
      pwVar6 = key1 + 2;
      do {
        uVar4 = (ulong)(ushort)wVar7 + (uVar4 >> 0x18) + uVar4 * 0x26;
        wVar7 = *pwVar6;
        pwVar6 = pwVar6 + 1;
      } while (wVar7 != L'\0');
    }
    uVar4 = uVar4 % pRVar1->fHashModulus;
  }
  pRVar8 = pRVar1->fBucketList[uVar4];
  if (pRVar8 != (RefHashTableBucketElem<char16_t> *)0x0) {
    do {
      bVar3 = xercesc_4_0::StringHasher::equals
                        ((StringHasher *)&pRVar1->field_0x30,key1,pRVar8->fKey);
      if (bVar3) {
        pXVar5 = pRVar8->fData;
        if (pXVar5 != (XMLCh *)0x0) {
          operator_delete__(key1);
          return pXVar5;
        }
        break;
      }
      pRVar8 = pRVar8->fNext;
    } while (pRVar8 != (RefHashTableBucketElem<char16_t> *)0x0);
  }
  pXVar5 = createID(this,obj);
  xercesc_4_0::RefHashTableOf<char16_t,_xercesc_4_0::StringHasher>::put(this->fIdMap,key1,pXVar5);
  this_00 = &this->fObjectLocations->super_BaseRefVectorOf<char16_t>;
  xercesc_4_0::BaseRefVectorOf<char16_t>::ensureExtraCapacity(this_00,1);
  XVar2 = this_00->fCurCount;
  this_00->fElemList[XVar2] = key1;
  this_00->fCurCount = XVar2 + 1;
  return pXVar5;
}

Assistant:

const XMLCh* PSVIWriterHandlers::getIdName(XSObject* obj) {
	XMLCh* objLoc = new XMLCh[9];
	XMLString::sizeToText((XMLSize_t)obj, objLoc, 8, 16);
	XMLCh* idName = fIdMap->get(objLoc);
	if (!idName) {
		idName = createID(obj);
		fIdMap->put(objLoc, idName);
		fObjectLocations->addElement(objLoc);
	} else {
		delete[] objLoc;
	}
	return idName;
}